

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cc
# Opt level: O0

void __thiscall tchecker::syncprod::system_t::system_t(system_t *this,system_declaration_t *sysdecl)

{
  system_declaration_t *sysdecl_local;
  system_t *this_local;
  
  tchecker::system::system_t::system_t(&this->super_system_t,sysdecl);
  labels_t::labels_t(&this->super_labels_t);
  std::
  vector<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>_>_>
  ::vector(&this->_async_outgoing_edges);
  std::
  vector<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>,_std::allocator<std::vector<std::shared_ptr<const_tchecker::system::edge_t>,_std::allocator<std::shared_ptr<const_tchecker::system::edge_t>_>_>_>_>
  ::vector(&this->_async_incoming_edges);
  boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::dynamic_bitset
            (&this->_committed);
  std::
  vector<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector(&this->_labels);
  extract_asynchronous_edges(this);
  compute_committed_locations(this);
  compute_labels(this);
  return;
}

Assistant:

system_t::system_t(tchecker::parsing::system_declaration_t const & sysdecl) : tchecker::system::system_t(sysdecl)
{
  extract_asynchronous_edges();
  compute_committed_locations();
  compute_labels();
}